

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lifo.h
# Opt level: O2

void __thiscall
density::detail::
LifoArrayImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
::LifoArrayImpl(LifoArrayImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                *this,size_t i_element_count)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ThreadLifoAllocator<0>::allocate(i_element_count << 5);
  this->m_elements = pbVar1;
  this->m_size = i_element_count;
  return;
}

Assistant:

LifoArrayImpl(size_t i_element_count)
                : m_elements(static_cast<TYPE *>(
                    detail::ThreadLifoAllocator<>::allocate(compute_mem_size(i_element_count)))),
                  m_size(i_element_count)
            {
            }